

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_qa.cpp
# Opt level: O2

Id dxil_spv::build_descriptor_qa_check_function(SPIRVModule *module)

{
  Id id_00;
  pointer ppIVar1;
  _Head_base<0UL,_spv::Instruction_*,_false> _Var2;
  Instruction *pIVar3;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> uVar4;
  SPIRVModule *pSVar5;
  pointer puVar6;
  Id IVar7;
  Id IVar8;
  Id IVar9;
  Builder *this;
  Builder *this_00;
  DescriptorQAInfo *pDVar10;
  Function *pFVar11;
  Block *pBVar12;
  Block *this_01;
  Block *pBVar13;
  Id IVar14;
  Id u32_type_1;
  undefined4 uStack_154;
  Id uvec2_type;
  undefined4 uStack_14c;
  Block *entry_1;
  Id u32_type;
  Id id;
  undefined4 uStack_134;
  _Head_base<0UL,_spv::Instruction_*,_false> local_130;
  Id local_128;
  Id local_124;
  Id u32_type_4;
  undefined4 uStack_11c;
  Id local_114;
  Function *local_110;
  Id local_104;
  Id local_100;
  Id local_fc;
  SPIRVModule *local_f8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_f0;
  Vector<spv::Id> comps;
  Id u32_type_3;
  undefined4 uStack_bc;
  Block *entry;
  Function *local_b0;
  Block *local_a8;
  Id local_9c;
  Vector<spv::Id> param_types;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Id u32_ptr_type;
  
  this = SPIRVModule::get_builder(module);
  this_00 = SPIRVModule::get_builder(module);
  param_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  param_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  param_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IVar7 = spv::Builder::makeUintType(this_00,0x20);
  u32_type_1 = IVar7;
  uvec2_type = spv::Builder::makeVectorType(this_00,IVar7,2);
  IVar7 = spv::Builder::makeRuntimeArray(this_00,IVar7);
  entry_1 = (Block *)CONCAT44(entry_1._4_4_,IVar7);
  spv::Builder::addDecoration(this_00,IVar7,DecorationArrayStride,4);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &uvec2_type);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             (value_type_conflict1 *)&entry_1);
  id = spv::Builder::makeStructType
                 (this_00,(Vector<Id> *)
                          &param_types.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                  ,"DescriptorHeapGlobalQAData");
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = &id;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this_00;
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,FailedShaderHash,0,"failed_shader_hash");
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,FailedOffset,8,"failed_offset");
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,FailedHeap,0xc,"failed_heap");
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,FailedCookie,0x10,"failed_cookie");
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,FaultAtomic,0x14,"fault_atomic");
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,FailedInstruction,0x18,"failed_instruction");
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,FailedDescriptorTypeMask,0x1c,
             "failed_descriptor_type_mask");
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,ActualDescriptorTypeMask,0x20,
             "actual_descriptor_type_mask");
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,FaultType,0x24,"fault_type");
  build_descriptor_global_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,LiveStatusTable,0x28,"live_status_table");
  spv::Builder::addDecoration(this_00,id,DecorationBlock,-1);
  IVar7 = id;
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  IVar7 = SPIRVModule::create_variable(module,StorageClassStorageBuffer,IVar7,"QAGlobalData");
  pDVar10 = SPIRVModule::get_descriptor_qa_info(module);
  local_124 = IVar7;
  spv::Builder::addDecoration(this_00,IVar7,DecorationDescriptorSet,pDVar10->global_desc_set);
  local_f8 = module;
  pDVar10 = SPIRVModule::get_descriptor_qa_info(module);
  spv::Builder::addDecoration(this_00,IVar7,DecorationBinding,pDVar10->global_binding);
  pBVar13 = this_00->buildPoint;
  entry_1 = (Block *)0x0;
  IVar7 = spv::Builder::makeUintType(this_00,0x20);
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(comps.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar7);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            (&param_types,7,(value_type_conflict1 *)&comps,(allocator_type *)&u32_type_1);
  IVar7 = spv::Builder::makeVoidType(this_00);
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar11 = spv::Builder::makeFunctionEntry
                      (this_00,DecorationMax,IVar7,"descriptor_qa_report_fault",&param_types,
                       (vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                        *)&comps,&entry_1);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             *)&comps);
  local_9c = (pFVar11->functionInstruction).resultId;
  ppIVar1 = (pFVar11->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_114 = (*ppIVar1)->resultId;
  IVar7 = ppIVar1[1]->resultId;
  IVar14 = ppIVar1[2]->resultId;
  IVar8 = ppIVar1[3]->resultId;
  IVar9 = ppIVar1[4]->resultId;
  id_00 = ppIVar1[5]->resultId;
  local_128 = ppIVar1[6]->resultId;
  local_110 = pFVar11;
  spv::Builder::addName(this_00,local_114,"fault_type");
  local_100 = IVar7;
  spv::Builder::addName(this_00,IVar7,"heap_offset");
  local_104 = IVar14;
  spv::Builder::addName(this_00,IVar14,"cookie");
  local_fc = IVar8;
  spv::Builder::addName(this_00,IVar8,"heap_index");
  local_b0 = (Function *)CONCAT44(local_b0._4_4_,IVar9);
  spv::Builder::addName(this_00,IVar9,"descriptor_type");
  local_a8 = (Block *)CONCAT44(local_a8._4_4_,id_00);
  spv::Builder::addName(this_00,id_00,"actual_descriptor_type");
  spv::Builder::addName(this_00,local_128,"instruction");
  u32_type = spv::Builder::makeUintType(this_00,0x20);
  u32_ptr_type = spv::Builder::makePointer(this_00,StorageClassStorageBuffer,u32_type);
  IVar7 = this_00->uniqueId + 1;
  this_00->uniqueId = IVar7;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(comps.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar7);
  u32_type_1 = 0x41;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            (&id,(uint *)&comps,&u32_ptr_type);
  spv::Instruction::addIdOperand(_id,local_124);
  _Var2._M_head_impl = _id;
  IVar7 = spv::Builder::makeUintConstant(this_00,4,false);
  spv::Instruction::addIdOperand(_Var2._M_head_impl,IVar7);
  IVar7 = this_00->uniqueId + 1;
  this_00->uniqueId = IVar7;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(comps.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar7);
  u32_type_1 = 0xea;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_130,(uint *)&comps,&u32_type);
  spv::Instruction::addIdOperand(local_130._M_head_impl,*(Id *)((long)_id + 8));
  _Var2._M_head_impl = local_130._M_head_impl;
  IVar7 = spv::Builder::makeUintConstant(this_00,1,false);
  spv::Instruction::addIdOperand(_Var2._M_head_impl,IVar7);
  _Var2._M_head_impl = local_130._M_head_impl;
  IVar7 = spv::Builder::makeUintConstant(this_00,0,false);
  spv::Instruction::addIdOperand(_Var2._M_head_impl,IVar7);
  _Var2._M_head_impl = local_130._M_head_impl;
  IVar7 = spv::Builder::makeUintConstant(this_00,1,false);
  spv::Instruction::addIdOperand(_Var2._M_head_impl,IVar7);
  IVar7 = this_00->uniqueId + 1;
  this_00->uniqueId = IVar7;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(comps.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar7);
  IVar7 = spv::Builder::makeBoolType(this_00);
  _u32_type_1 = (Instruction *)CONCAT44(uStack_154,IVar7);
  uvec2_type = 0xaa;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            (&u32_type_4,(uint *)&comps,&u32_type_1);
  spv::Instruction::addIdOperand
            (_u32_type_4,
             *(Id *)&(((Vector<std::unique_ptr<Instruction>_> *)&(local_130._M_head_impl)->resultId)
                     ->
                     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  _Var2._M_head_impl = _u32_type_4;
  IVar7 = spv::Builder::makeUintConstant(this_00,0,false);
  spv::Instruction::addIdOperand(_Var2._M_head_impl,IVar7);
  IVar7 = _u32_type_4->resultId;
  pBVar12 = (Block *)allocate_in_thread(0x78);
  pFVar11 = local_110;
  IVar14 = this_00->uniqueId + 1;
  this_00->uniqueId = IVar14;
  spv::Block::Block(pBVar12,IVar14,local_110);
  this_01 = (Block *)allocate_in_thread(0x78);
  IVar14 = this_00->uniqueId + 1;
  this_00->uniqueId = IVar14;
  spv::Block::Block(this_01,IVar14,pFVar11);
  this_00->buildPoint = entry_1;
  local_f0._M_head_impl = _id;
  _id = (Instruction *)0x0;
  spv::Block::addInstruction
            (entry_1,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_f0);
  if (local_f0._M_head_impl != (Instruction *)0x0) {
    (*(local_f0._M_head_impl)->_vptr_Instruction[1])();
  }
  local_f0._M_head_impl = (Instruction *)0x0;
  entry = (Block *)local_130._M_head_impl;
  local_130._M_head_impl = (Instruction *)0x0;
  spv::Block::addInstruction
            (entry_1,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&entry)
  ;
  if (entry != (Block *)0x0) {
    (*entry->_vptr_Block[1])();
  }
  entry = (Block *)0x0;
  _u32_type_3 = _u32_type_4;
  _u32_type_4 = (Instruction *)0x0;
  spv::Block::addInstruction
            (entry_1,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &u32_type_3);
  if ((_Head_base<0UL,_spv::Instruction_*,_false>)_u32_type_3 !=
      (_Head_base<0UL,_spv::Instruction_*,_false>)0x0) {
    (*_u32_type_3->_vptr_Instruction[1])();
  }
  _u32_type_3 = (Instruction *)0x0;
  spv::Builder::createSelectionMerge(this_00,this_01,0);
  local_110 = (Function *)this_01;
  spv::Builder::createConditionalBranch(this_00,IVar7,pBVar12,this_01);
  IVar14 = local_124;
  this_00->buildPoint = pBVar12;
  build_ssbo_store(this_00,u32_type,local_124,3,local_104);
  build_ssbo_store(this_00,u32_type,IVar14,1,local_100);
  build_ssbo_store(this_00,u32_type,IVar14,2,local_fc);
  build_ssbo_store(this_00,u32_type,IVar14,6,(Id)local_b0);
  build_ssbo_store(this_00,u32_type,IVar14,7,(Id)local_a8);
  build_ssbo_store(this_00,u32_type,IVar14,5,local_128);
  local_128 = spv::Builder::makeVectorType(this_00,u32_type,2);
  pSVar5 = local_f8;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar10 = SPIRVModule::get_descriptor_qa_info(local_f8);
  IVar7 = spv::Builder::makeUintConstant(this_00,(uint)pDVar10->shader_hash,false);
  u32_type_1 = IVar7;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
  emplace_back<unsigned_int>(&comps,&u32_type_1);
  pDVar10 = SPIRVModule::get_descriptor_qa_info(pSVar5);
  IVar7 = spv::Builder::makeUintConstant(this_00,*(uint *)((long)&pDVar10->shader_hash + 4),false);
  _u32_type_1 = (Instruction *)CONCAT44(uStack_154,IVar7);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
  emplace_back<unsigned_int>(&comps,&u32_type_1);
  IVar7 = local_128;
  IVar8 = spv::Builder::makeCompositeConstant(this_00,local_128,&comps,false);
  build_ssbo_store(this_00,IVar7,IVar14,0,IVar8);
  uvec2_type = 0xe1;
  std::make_unique<spv::Instruction,spv::Op>(&u32_type_1);
  _Var2._M_head_impl = _u32_type_1;
  IVar7 = spv::Builder::makeUintConstant(this_00,1,false);
  spv::Instruction::addIdOperand(_Var2._M_head_impl,IVar7);
  _Var2._M_head_impl = _u32_type_1;
  IVar7 = spv::Builder::makeUintConstant(this_00,0x48,false);
  spv::Instruction::addIdOperand(_Var2._M_head_impl,IVar7);
  _uvec2_type = _u32_type_1;
  _u32_type_1 = (Instruction *)0x0;
  spv::Block::addInstruction
            (this_00->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&uvec2_type);
  if ((_Head_base<0UL,_spv::Instruction_*,_false>)_uvec2_type !=
      (_Head_base<0UL,_spv::Instruction_*,_false>)0x0) {
    (*_uvec2_type->_vptr_Instruction[1])();
  }
  _uvec2_type = (Instruction *)0x0;
  if (_u32_type_1 != (Instruction *)0x0) {
    (**(code **)(*(long *)_u32_type_1 + 8))();
  }
  build_ssbo_store(this_00,u32_type,local_124,8,local_114);
  pFVar11 = local_110;
  spv::Builder::createBranch(this_00,(Block *)local_110);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)
  ;
  this_00->buildPoint = (Block *)pFVar11;
  spv::Builder::makeReturn(this_00,false,0);
  this_00->buildPoint = pBVar13;
  if (_u32_type_4 != (Instruction *)0x0) {
    (**(code **)(*(long *)_u32_type_4 + 8))();
  }
  if (local_130._M_head_impl != (Instruction *)0x0) {
    (*(local_130._M_head_impl)->_vptr_Instruction[1])();
  }
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)_id !=
      (Instruction *)0x0) {
    (**(code **)(*(long *)_id + 8))();
  }
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  param_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  param_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  param_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IVar7 = spv::Builder::makeUintType(this,0x20);
  u32_type_1 = IVar7;
  IVar7 = spv::Builder::makeVectorType(this,IVar7,2);
  IVar7 = spv::Builder::makeRuntimeArray(this,IVar7);
  uvec2_type = IVar7;
  spv::Builder::addDecoration(this,IVar7,DecorationArrayStride,8);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &u32_type_1);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
             &param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
             &uvec2_type);
  IVar7 = spv::Builder::makeStructType
                    (this,(Vector<Id> *)
                          &param_types.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ,"DescriptorHeapQAData");
  entry_1 = (Block *)CONCAT44(entry_1._4_4_,IVar7);
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&entry_1;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this;
  build_descriptor_qa_heap_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,DescriptorCount,0,"descriptor_count");
  build_descriptor_qa_heap_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,HeapIndex,4,"heap_index");
  build_descriptor_qa_heap_buffer_type::anon_class_16_2_d2793597::operator()
            ((anon_class_16_2_d2793597 *)&comps,CookiesDescriptorInfo,8,"cookies_descriptor_info");
  spv::Builder::addDecoration(this,(Id)entry_1,DecorationBlock,-1);
  IVar7 = (Id)entry_1;
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  pSVar5 = local_f8;
  IVar9 = SPIRVModule::create_variable(local_f8,StorageClassStorageBuffer,IVar7,"QAHeapData");
  pDVar10 = SPIRVModule::get_descriptor_qa_info(pSVar5);
  spv::Builder::addDecoration(this,IVar9,DecorationDescriptorSet,pDVar10->heap_desc_set);
  pDVar10 = SPIRVModule::get_descriptor_qa_info(pSVar5);
  spv::Builder::addDecoration(this,IVar9,DecorationBinding,pDVar10->heap_binding);
  spv::Builder::addDecoration(this,IVar9,DecorationNonWritable,-1);
  local_a8 = this->buildPoint;
  entry = (Block *)0x0;
  IVar7 = spv::Builder::makeUintType(this,0x20);
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(comps.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar7);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            (&param_types,3,(value_type_conflict1 *)&comps,(allocator_type *)&u32_type_1);
  IVar7 = spv::Builder::makeUintType(this,0x20);
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar11 = spv::Builder::makeFunctionEntry
                      (this,DecorationMax,IVar7,"descriptor_qa_check",&param_types,
                       (vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                        *)&comps,&entry);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             *)&comps);
  this->buildPoint = entry;
  ppIVar1 = (pFVar11->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  IVar7 = (*ppIVar1)->resultId;
  IVar14 = ppIVar1[1]->resultId;
  IVar8 = ppIVar1[2]->resultId;
  local_b0 = pFVar11;
  spv::Builder::addName(this,IVar7,"heap_offset");
  spv::Builder::addName(this,IVar14,"descriptor_type_mask");
  local_fc = IVar8;
  spv::Builder::addName(this,IVar8,"instruction");
  IVar8 = spv::Builder::makeUintType(this,0x20);
  local_128 = build_ssbo_load(this,IVar8,IVar9,0);
  IVar8 = spv::Builder::makeUintType(this,0x20);
  local_100 = build_ssbo_load(this,IVar8,IVar9,1);
  IVar8 = spv::Builder::makeUintType(this,0x20);
  IVar8 = spv::Builder::makeVectorType(this,IVar8,2);
  local_f8 = (SPIRVModule *)CONCAT44(local_f8._4_4_,IVar7);
  IVar7 = build_ssbo_load_array(this,IVar8,IVar9,2,IVar7);
  IVar8 = spv::Builder::makeUintType(this,0x20);
  u32_type_3 = IVar8;
  IVar8 = this->uniqueId + 1;
  this->uniqueId = IVar8;
  _u32_type_1 = (Instruction *)CONCAT44(uStack_154,IVar8);
  uvec2_type = 0x51;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&comps,&u32_type_1,&u32_type_3);
  spv::Instruction::addIdOperand
            ((Instruction *)
             comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,IVar7);
  spv::Instruction::addImmediateOperand
            ((Instruction *)
             comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,0);
  uvec2_type = this->uniqueId + 1;
  this->uniqueId = uvec2_type;
  entry_1 = (Block *)CONCAT44(entry_1._4_4_,0x51);
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            (&u32_type_1,&uvec2_type,&u32_type_3);
  spv::Instruction::addIdOperand(_u32_type_1,IVar7);
  spv::Instruction::addImmediateOperand(_u32_type_1,1);
  IVar7 = this->uniqueId + 1;
  this->uniqueId = IVar7;
  entry_1 = (Block *)CONCAT44(entry_1._4_4_,IVar7);
  id = 0xc2;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            (&uvec2_type,(uint *)&entry_1,&u32_type_3);
  spv::Instruction::addIdOperand
            (_uvec2_type,
             comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  _Var2._M_head_impl = _uvec2_type;
  IVar7 = spv::Builder::makeUintConstant(this,5,false);
  spv::Instruction::addIdOperand(_Var2._M_head_impl,IVar7);
  id = this->uniqueId + 1;
  this->uniqueId = id;
  local_130._M_head_impl._0_4_ = 199;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&entry_1,&id,&u32_type_3);
  spv::Instruction::addIdOperand
            ((Instruction *)entry_1,
             comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  pBVar13 = entry_1;
  IVar7 = spv::Builder::makeUintConstant(this,0x1f,false);
  spv::Instruction::addIdOperand((Instruction *)pBVar13,IVar7);
  local_104 = comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[2];
  local_114 = _u32_type_1->resultId;
  IVar7 = _uvec2_type->resultId;
  local_110 = (Function *)
              CONCAT44(local_110._4_4_,
                       *(undefined4 *)
                        &(entry_1->instructions).
                         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  _id = (Instruction *)
        comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&id);
  if ((_Head_base<0UL,_spv::Instruction_*,_false>)_id !=
      (_Head_base<0UL,_spv::Instruction_*,_false>)0x0) {
    (*_id->_vptr_Instruction[1])();
  }
  _id = (Instruction *)0x0;
  local_130._M_head_impl = _uvec2_type;
  _uvec2_type = (Instruction *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_130);
  if (local_130._M_head_impl != (Instruction *)0x0) {
    (*(local_130._M_head_impl)->_vptr_Instruction[1])();
  }
  local_130._M_head_impl = (Instruction *)0x0;
  _u32_type_4 = (Instruction *)entry_1;
  entry_1 = (Block *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&u32_type_4);
  if ((_Head_base<0UL,_spv::Instruction_*,_false>)_u32_type_4 !=
      (_Head_base<0UL,_spv::Instruction_*,_false>)0x0) {
    (*_u32_type_4->_vptr_Instruction[1])();
  }
  _u32_type_4 = (Instruction *)0x0;
  local_f0._M_head_impl = _u32_type_1;
  _u32_type_1 = (Instruction *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_f0);
  if (local_f0._M_head_impl != (Instruction *)0x0) {
    (*(local_f0._M_head_impl)->_vptr_Instruction[1])();
  }
  local_f0._M_head_impl = (Instruction *)0x0;
  if (entry_1 != (Block *)0x0) {
    (*entry_1->_vptr_Block[1])();
  }
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)_uvec2_type !=
      (Instruction *)0x0) {
    (**(code **)(*(long *)_uvec2_type + 8))();
  }
  if (_u32_type_1 != (Instruction *)0x0) {
    (**(code **)(*(long *)_u32_type_1 + 8))();
  }
  if (comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)comps.
                          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  IVar8 = spv::Builder::makeUintType(this,0x20);
  IVar7 = build_ssbo_load_array(this,IVar8,local_124,9,IVar7);
  IVar8 = spv::Builder::makeUintType(this,0x20);
  u32_type_4 = IVar8;
  IVar8 = this->uniqueId + 1;
  this->uniqueId = IVar8;
  _u32_type_1 = (Instruction *)CONCAT44(uStack_154,IVar8);
  uvec2_type = 0xc4;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&comps,&u32_type_1,&u32_type_4);
  puVar6 = comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  IVar8 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand((Instruction *)puVar6,IVar8);
  spv::Instruction::addIdOperand
            ((Instruction *)
             comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,(Id)local_110);
  uvec2_type = this->uniqueId + 1;
  this->uniqueId = uvec2_type;
  entry_1 = (Block *)CONCAT44(entry_1._4_4_,199);
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            (&u32_type_1,&uvec2_type,&u32_type_4);
  spv::Instruction::addIdOperand(_u32_type_1,IVar7);
  spv::Instruction::addIdOperand
            (_u32_type_1,
             comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  IVar7 = this->uniqueId + 1;
  this->uniqueId = IVar7;
  entry_1 = (Block *)CONCAT44(entry_1._4_4_,IVar7);
  IVar7 = spv::Builder::makeBoolType(this);
  id = IVar7;
  local_130._M_head_impl._0_4_ = 0xab;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            (&uvec2_type,(uint *)&entry_1,&id);
  spv::Instruction::addIdOperand(_uvec2_type,_u32_type_1->resultId);
  uVar4._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       _uvec2_type;
  IVar7 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand
            ((Instruction *)
             uVar4._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,IVar7);
  local_124 = *(Id *)((long)_uvec2_type + 8);
  entry_1 = (Block *)comps.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&entry_1);
  if (entry_1 != (Block *)0x0) {
    (*entry_1->_vptr_Block[1])();
  }
  entry_1 = (Block *)0x0;
  _id = _u32_type_1;
  _u32_type_1 = (Instruction *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&id);
  if ((_Head_base<0UL,_spv::Instruction_*,_false>)_id !=
      (_Head_base<0UL,_spv::Instruction_*,_false>)0x0) {
    (*_id->_vptr_Instruction[1])();
  }
  _id = (Instruction *)0x0;
  local_130._M_head_impl = _uvec2_type;
  _uvec2_type = (Instruction *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_130);
  if (local_130._M_head_impl != (Instruction *)0x0) {
    (*(local_130._M_head_impl)->_vptr_Instruction[1])();
  }
  local_130._M_head_impl = (Instruction *)0x0;
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)_uvec2_type !=
      (Instruction *)0x0) {
    (**(code **)(*(long *)_uvec2_type + 8))();
  }
  if (_u32_type_1 != (Instruction *)0x0) {
    (**(code **)(*(long *)_u32_type_1 + 8))();
  }
  if (comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)comps.
                          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  IVar7 = spv::Builder::makeUintType(this,0x20);
  IVar7 = build_binary_op(this,IVar7,OpBitwiseAnd,local_114,IVar14);
  IVar8 = spv::Builder::makeBoolType(this);
  IVar7 = build_binary_op(this,IVar8,OpIEqual,IVar7,IVar14);
  local_110 = (Function *)CONCAT44(local_110._4_4_,IVar7);
  IVar7 = spv::Builder::makeBoolType(this);
  IVar7 = build_binary_op(this,IVar7,OpUGreaterThanEqual,(Id)local_f8,local_128);
  IVar8 = this->uniqueId + 1;
  this->uniqueId = IVar8;
  _u32_type_1 = (Instruction *)CONCAT44(uStack_154,IVar8);
  IVar8 = spv::Builder::makeUintType(this,0x20);
  entry_1 = (Block *)CONCAT44(entry_1._4_4_,0xa9);
  uvec2_type = IVar8;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&comps,&u32_type_1,&uvec2_type);
  spv::Instruction::addIdOperand
            ((Instruction *)
             comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,IVar7);
  puVar6 = comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  IVar7 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand((Instruction *)puVar6,IVar7);
  puVar6 = comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  IVar7 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand((Instruction *)puVar6,IVar7);
  uvec2_type = this->uniqueId + 1;
  this->uniqueId = uvec2_type;
  IVar7 = spv::Builder::makeUintType(this,0x20);
  entry_1 = (Block *)CONCAT44(entry_1._4_4_,IVar7);
  id = 0xa9;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            (&u32_type_1,&uvec2_type,(Op *)&entry_1);
  spv::Instruction::addIdOperand(_u32_type_1,(Id)local_110);
  pIVar3 = _u32_type_1;
  IVar7 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar3,IVar7);
  pIVar3 = _u32_type_1;
  IVar7 = spv::Builder::makeUintConstant(this,2,false);
  spv::Instruction::addIdOperand(pIVar3,IVar7);
  IVar7 = this->uniqueId + 1;
  this->uniqueId = IVar7;
  entry_1 = (Block *)CONCAT44(entry_1._4_4_,IVar7);
  id = spv::Builder::makeUintType(this,0x20);
  local_130._M_head_impl._0_4_ = 0xa9;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            (&uvec2_type,(uint *)&entry_1,&id);
  spv::Instruction::addIdOperand(_uvec2_type,local_124);
  uVar4._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       _uvec2_type;
  IVar7 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand
            ((Instruction *)
             uVar4._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,IVar7);
  uVar4._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       _uvec2_type;
  IVar7 = spv::Builder::makeUintConstant(this,4,false);
  spv::Instruction::addIdOperand
            ((Instruction *)
             uVar4._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,IVar7);
  id = this->uniqueId + 1;
  this->uniqueId = id;
  local_130._M_head_impl._0_4_ = spv::Builder::makeUintType(this,0x20);
  u32_type_4 = 0xc5;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&entry_1,&id,(Op *)&local_130);
  local_130._M_head_impl._0_4_ = this->uniqueId + 1;
  this->uniqueId = (Id)local_130._M_head_impl;
  u32_type_4 = spv::Builder::makeUintType(this,0x20);
  local_f0._M_head_impl._0_4_ = 0xc5;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            (&id,(uint *)&local_130,&u32_type_4);
  spv::Instruction::addIdOperand
            ((Instruction *)entry_1,
             comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  spv::Instruction::addIdOperand((Instruction *)entry_1,_u32_type_1->resultId);
  spv::Instruction::addIdOperand
            (_id,*(Id *)&(entry_1->instructions).
                         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  spv::Instruction::addIdOperand(_id,_uvec2_type->resultId);
  u32_type_4 = this->uniqueId + 1;
  this->uniqueId = u32_type_4;
  local_f0._M_head_impl._0_4_ = spv::Builder::makeBoolType(this);
  u32_type_3 = 0xab;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&local_130,&u32_type_4,(Op *)&local_f0);
  spv::Instruction::addIdOperand(local_130._M_head_impl,*(Id *)((long)_id + 8));
  _Var2._M_head_impl = local_130._M_head_impl;
  IVar7 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(_Var2._M_head_impl,IVar7);
  IVar7 = *(Id *)((long)_id + 8);
  IVar8 = (local_130._M_head_impl)->resultId;
  local_40._M_head_impl =
       (Instruction *)
       comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_start;
  comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Instruction[1])();
  }
  local_40._M_head_impl = (Instruction *)0x0;
  local_48._M_head_impl = _u32_type_1;
  _u32_type_1 = (Instruction *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
  pFVar11 = local_b0;
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  local_48._M_head_impl = (Instruction *)0x0;
  local_50._M_head_impl = _uvec2_type;
  _uvec2_type = (Instruction *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Instruction[1])();
  }
  local_50._M_head_impl = (Instruction *)0x0;
  local_58._M_head_impl = (Instruction *)entry_1;
  entry_1 = (Block *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_58);
  if ((Block *)local_58._M_head_impl != (Block *)0x0) {
    (*(local_58._M_head_impl)->_vptr_Instruction[1])();
  }
  local_58._M_head_impl = (Instruction *)0x0;
  local_60._M_head_impl = _id;
  _id = (Instruction *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_60);
  if (local_60._M_head_impl != (Instruction *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Instruction[1])();
  }
  local_60._M_head_impl = (Instruction *)0x0;
  local_68._M_head_impl = local_130._M_head_impl;
  local_130._M_head_impl = (Instruction *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_68);
  if (local_68._M_head_impl != (Instruction *)0x0) {
    (*(local_68._M_head_impl)->_vptr_Instruction[1])();
  }
  local_68._M_head_impl = (Instruction *)0x0;
  pBVar13 = (Block *)allocate_in_thread(0x78);
  IVar9 = this->uniqueId + 1;
  this->uniqueId = IVar9;
  spv::Block::Block(pBVar13,IVar9,pFVar11);
  pBVar12 = (Block *)allocate_in_thread(0x78);
  IVar9 = this->uniqueId + 1;
  this->uniqueId = IVar9;
  spv::Block::Block(pBVar12,IVar9,pFVar11);
  spv::Builder::createSelectionMerge(this,pBVar12,0);
  spv::Builder::createConditionalBranch(this,IVar8,pBVar13,pBVar12);
  this->buildPoint = pBVar13;
  IVar8 = this->uniqueId + 1;
  this->uniqueId = IVar8;
  local_f0._M_head_impl._0_4_ = IVar8;
  IVar8 = spv::Builder::makeVoidType(this);
  u32_type_3 = IVar8;
  u32_type = 0x39;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            (&u32_type_4,(uint *)&local_f0,&u32_type_3);
  spv::Instruction::addIdOperand(_u32_type_4,local_9c);
  spv::Instruction::addIdOperand(_u32_type_4,IVar7);
  spv::Instruction::addIdOperand(_u32_type_4,(Id)local_f8);
  spv::Instruction::addIdOperand(_u32_type_4,local_104);
  spv::Instruction::addIdOperand(_u32_type_4,local_100);
  spv::Instruction::addIdOperand(_u32_type_4,IVar14);
  spv::Instruction::addIdOperand(_u32_type_4,local_114);
  spv::Instruction::addIdOperand(_u32_type_4,local_fc);
  local_70._M_head_impl = _u32_type_4;
  _u32_type_4 = (Instruction *)0x0;
  spv::Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_70);
  if (local_70._M_head_impl != (Instruction *)0x0) {
    (*(local_70._M_head_impl)->_vptr_Instruction[1])();
  }
  local_70._M_head_impl = (Instruction *)0x0;
  spv::Builder::makeReturn(this,false,local_128);
  if (_u32_type_4 != (Instruction *)0x0) {
    (*_u32_type_4->_vptr_Instruction[1])();
  }
  this->buildPoint = pBVar12;
  spv::Builder::makeReturn(this,false,(Id)local_f8);
  this->buildPoint = local_a8;
  IVar7 = (pFVar11->functionInstruction).resultId;
  if (local_130._M_head_impl != (Instruction *)0x0) {
    (*(local_130._M_head_impl)->_vptr_Instruction[1])();
  }
  if (_id != (Instruction *)0x0) {
    (*_id->_vptr_Instruction[1])();
  }
  if (entry_1 != (Block *)0x0) {
    (*entry_1->_vptr_Block[1])();
  }
  if (_uvec2_type != (Instruction *)0x0) {
    (*_uvec2_type->_vptr_Instruction[1])();
  }
  if (_u32_type_1 != (Instruction *)0x0) {
    (**(code **)(*(long *)_u32_type_1 + 8))();
  }
  if (comps.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)comps.
                          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&param_types.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  return IVar7;
}

Assistant:

spv::Id build_descriptor_qa_check_function(SPIRVModule &module)
{
	auto &builder = module.get_builder();
	spv::Id fault_func_id, global_buffer_id;
	build_descriptor_qa_fault_report(module, fault_func_id, global_buffer_id);

	spv::Id heap_buffer_type_id = build_descriptor_qa_heap_buffer_type(builder);
	spv::Id descriptor_qa_heap_buffer_id = module.create_variable(spv::StorageClassStorageBuffer,
	                                                              heap_buffer_type_id, "QAHeapData");
	builder.addDecoration(descriptor_qa_heap_buffer_id, spv::DecorationDescriptorSet,
	                      module.get_descriptor_qa_info().heap_desc_set);
	builder.addDecoration(descriptor_qa_heap_buffer_id, spv::DecorationBinding,
	                      module.get_descriptor_qa_info().heap_binding);
	builder.addDecoration(descriptor_qa_heap_buffer_id, spv::DecorationNonWritable);

	auto heap_buffer_id = descriptor_qa_heap_buffer_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;

	Vector<spv::Id> param_types(3, builder.makeUintType(32));
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeUintType(32),
	                                       "descriptor_qa_check",
	                                       param_types, {}, &entry);
	builder.setBuildPoint(entry);

	spv::Id offset_id = func->getParamId(0);
	spv::Id descriptor_type_id = func->getParamId(1);
	spv::Id instruction_id = func->getParamId(2);

	builder.addName(offset_id, "heap_offset");
	builder.addName(descriptor_type_id, "descriptor_type_mask");
	builder.addName(instruction_id, "instruction");

	spv::Id descriptor_count_id = build_ssbo_load(builder, builder.makeUintType(32), heap_buffer_id,
	                                              uint32_t(DescriptorQAHeapMembers::DescriptorCount));

	spv::Id fallback_offset_id = descriptor_count_id;

	spv::Id heap_id = build_ssbo_load(builder, builder.makeUintType(32), heap_buffer_id,
	                                  uint32_t(DescriptorQAHeapMembers::HeapIndex));
	spv::Id cookie_descriptor_info = build_ssbo_load_array(builder, builder.makeVectorType(builder.makeUintType(32), 2),
	                                                       heap_buffer_id,
	                                                       uint32_t(DescriptorQAHeapMembers::CookiesDescriptorInfo),
	                                                       offset_id);
	spv::Id cookie_id;
	spv::Id cookie_shifted_id;
	spv::Id cookie_mask_id;
	spv::Id descriptor_info_id;
	build_cookie_descriptor_info_split(builder, cookie_descriptor_info, cookie_id,
	                                   cookie_shifted_id, cookie_mask_id, descriptor_info_id);

	spv::Id live_status_id = build_ssbo_load_array(builder, builder.makeUintType(32),
	                                               global_buffer_id,
	                                               uint32_t(DescriptorQAGlobalMembers::LiveStatusTable),
	                                               cookie_shifted_id);
	spv::Id live_status_cond_id = build_live_check(builder, live_status_id, cookie_mask_id);

	spv::Id type_cond_id = build_binary_op(builder, builder.makeUintType(32), spv::OpBitwiseAnd, descriptor_info_id, descriptor_type_id);
	type_cond_id = build_binary_op(builder, builder.makeBoolType(), spv::OpIEqual,
	                               type_cond_id, descriptor_type_id);

	spv::Id out_of_range_id = build_binary_op(builder, builder.makeBoolType(), spv::OpUGreaterThanEqual,
	                                          offset_id, descriptor_count_id);

	// First check: descriptor index is in range of heap.
	auto range_check = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpSelect);
	range_check->addIdOperand(out_of_range_id);
	range_check->addIdOperand(builder.makeUintConstant(DESCRIPTOR_QA_FAULT_INDEX_OUT_OF_RANGE_BIT));
	range_check->addIdOperand(builder.makeUintConstant(0u));

	// Second: Check if type matches.
	auto type_check = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpSelect);
	type_check->addIdOperand(type_cond_id);
	type_check->addIdOperand(builder.makeUintConstant(0u));
	type_check->addIdOperand(builder.makeUintConstant(DESCRIPTOR_QA_FAULT_INVALID_TYPE_BIT));

	// Third: Check if cookie is alive.
	auto alive_check = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpSelect);
	alive_check->addIdOperand(live_status_cond_id);
	alive_check->addIdOperand(builder.makeUintConstant(0u));
	alive_check->addIdOperand(builder.makeUintConstant(DESCRIPTOR_QA_FAULT_RESOURCE_DESTROYED_BIT));

	auto merge_check0 = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpBitwiseOr);
	auto merge_check1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpBitwiseOr);
	merge_check0->addIdOperand(range_check->getResultId());
	merge_check0->addIdOperand(type_check->getResultId());
	merge_check1->addIdOperand(merge_check0->getResultId());
	merge_check1->addIdOperand(alive_check->getResultId());

	auto fault_cond = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeBoolType(), spv::OpINotEqual);
	fault_cond->addIdOperand(merge_check1->getResultId());
	fault_cond->addIdOperand(builder.makeUintConstant(0u));

	spv::Id fault_type_id = merge_check1->getResultId();
	spv::Id fault_cond_id = fault_cond->getResultId();

	builder.getBuildPoint()->addInstruction(std::move(range_check));
	builder.getBuildPoint()->addInstruction(std::move(type_check));
	builder.getBuildPoint()->addInstruction(std::move(alive_check));
	builder.getBuildPoint()->addInstruction(std::move(merge_check0));
	builder.getBuildPoint()->addInstruction(std::move(merge_check1));
	builder.getBuildPoint()->addInstruction(std::move(fault_cond));

	auto *fault_block = new spv::Block(builder.getUniqueId(), *func);
	auto *correct_block = new spv::Block(builder.getUniqueId(), *func);
	builder.createSelectionMerge(correct_block, 0);
	builder.createConditionalBranch(fault_cond_id, fault_block, correct_block);
	{
		builder.setBuildPoint(fault_block);
		auto call = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeVoidType(), spv::OpFunctionCall);
		call->addIdOperand(fault_func_id);
		call->addIdOperand(fault_type_id);
		call->addIdOperand(offset_id);
		call->addIdOperand(cookie_id);
		call->addIdOperand(heap_id);
		call->addIdOperand(descriptor_type_id);
		call->addIdOperand(descriptor_info_id);
		call->addIdOperand(instruction_id);
		builder.getBuildPoint()->addInstruction(std::move(call));
		builder.makeReturn(false, fallback_offset_id);
	}
	builder.setBuildPoint(correct_block);
	builder.makeReturn(false, offset_id);

	builder.setBuildPoint(current_build_point);
	return func->getId();
}